

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

bool __thiscall chatter::Protocol::handle_pong(Protocol *this,ptr *packet)

{
  uint64_t peer_00;
  element_type *peVar1;
  uint64_t uVar2;
  size_t in_RCX;
  void *__buf;
  bool bVar3;
  long local_30;
  uint64_t ts;
  Peer *peer;
  ptr *packet_local;
  Protocol *this_local;
  
  peer = (Peer *)packet;
  packet_local = (ptr *)this;
  peVar1 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)packet);
  ts = (uint64_t)peVar1->m_peer;
  bVar3 = ((Peer *)ts)->m_state == CONNECTED;
  if (bVar3) {
    peVar1 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)packet);
    Packet::read(peVar1,(int)&local_30,__buf,in_RCX);
    peer_00 = ts;
    uVar2 = Host::timestamp_now(this->m_host);
    calculate_rtt(this,(Peer *)peer_00,uVar2 - local_30);
  }
  return bVar3;
}

Assistant:

bool Protocol::handle_pong(const Packet::ptr packet)
{
    Peer* peer = packet->m_peer;
    if (peer->m_state != PeerState::CONNECTED)
        /* TODO(ben): Peer not connected error */
        return false;

    uint64_t ts;
    packet->read(ts);

    calculate_rtt(peer, m_host->timestamp_now() - ts);

    return true;
}